

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

string * sensors_analytics::utils::UrlDecode(string *__return_storage_ptr__,string *data)

{
  ulong uVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  uVar1 = data->_M_string_length;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if ((data->_M_dataplus)._M_p[uVar2] == '%') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar2 = uVar2 + 2;
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string UrlDecode(const string &data)
{
    std::string result = "";
    size_t length = data.length();
    for (size_t i = 0; i < length; i++)
    {
        if (data[i] == '+') result += ' ';
        else if (data[i] == '%') {
            unsigned char high = DecimalFromHex((unsigned char)data[++i]);
            unsigned char low = DecimalFromHex((unsigned char)data[++i]);
            result += high * 16 + low;
        }
        else result += data[i];
    }
    return result;
}